

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::UncoreMinimize::addOll(UncoreMinimize *this,Solver *s,LitPair *lits,uint32 size,weight_t w)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  
  (this->temp_).lits.ebo_.size = 0;
  (this->temp_).bound = 2;
  if (size != 0) {
    uVar3 = 0;
    do {
      WCTemp::add(&this->temp_,s,(Literal)lits[uVar3].lit.rep_);
      uVar3 = uVar3 + 1;
    } while (size != uVar3);
  }
  uVar1 = (this->temp_).bound;
  if ((0 < (int)uVar1) && ((this->temp_).lits.ebo_.size < uVar1)) {
    if ((int)uVar1 < 2) {
      return true;
    }
    if ((this->temp_).lits.ebo_.size != 0) {
      lits = (LitPair *)(this->temp_).lits.ebo_.buf;
    }
    bVar2 = fixLit(this,s,(Literal)(((pointer)lits)->first).rep_);
    return bVar2;
  }
  bVar2 = addOllCon(this,s,&this->temp_,w);
  return bVar2;
}

Assistant:

bool UncoreMinimize::addOll(Solver& s, const LitPair* lits, uint32 size, weight_t w) {
	temp_.start(2);
	for (uint32 i = 0; i != size; ++i) { temp_.add(s, lits[i].lit); }
	if (!temp_.unsat()) {
		return addOllCon(s, temp_, w);
	}
	Literal fix = !temp_.lits.empty() ? temp_.lits[0].first : lits[0].lit;
	return temp_.bound < 2 || fixLit(s, fix);
}